

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
flatbuffers::python::grpc::anon_unknown_0::BaseGenerator::BaseGenerator
          (BaseGenerator *this,Parser *parser,Config *config,string *path,Version *version)

{
  int16_t iVar1;
  Version *version_00;
  Config result;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  undefined1 local_170 [136];
  string local_e8 [104];
  string local_80 [32];
  string local_60 [64];
  
  this->parser_ = parser;
  Namer::Config::Config((Config *)local_170,config);
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x68));
  std::__cxx11::string::_M_assign(local_e8);
  std::__cxx11::string::_M_assign(local_80);
  std::__cxx11::string::_M_assign(local_60);
  Keywords_abi_cxx11_((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1a0,(python *)version,version_00);
  IdlNamer::IdlNamer(&this->namer_,(Config *)local_170,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1a0);
  Namer::Config::~Config((Config *)local_170);
  (this->version_).micro = version->micro;
  iVar1 = version->minor;
  (this->version_).major = version->major;
  (this->version_).minor = iVar1;
  return;
}

Assistant:

BaseGenerator(const Parser &parser, const Namer::Config &config,
                const std::string &path, const Version &version)
      : parser_{parser},
        namer_{WithFlagOptions(config, parser.opts, path), Keywords(version)},
        version_{version} {}